

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

void __thiscall
Js::JavascriptLibrary::SetCrossSiteForLockedFunctionType
          (JavascriptLibrary *this,JavascriptFunction *function)

{
  undefined8 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  DynamicType *type;
  
  if (*(char *)&(function->super_DynamicObject).super_RecyclableObject.type.ptr[1].javascriptLibrary
                .ptr == '\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x163f,"(function->GetDynamicType()->GetIsLocked())",
                                "function->GetDynamicType()->GetIsLocked()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  bVar3 = VarIs<Js::ScriptFunction,Js::JavascriptFunction>(function);
  if (!bVar3) {
    bVar3 = VarIs<Js::BoundFunction,Js::JavascriptFunction>(function);
    if (!bVar3) {
      puVar1 = *(undefined8 **)((function->super_DynamicObject).super_RecyclableObject.type.ptr + 1)
      ;
      if (puVar1 == &DeferredTypeHandler<&(bool_Js::JavascriptLibrary::InitializeFunction<true,true,false,false>(Js::DynamicObject*,Js::DeferredTypeHandlerBase*,Js::DeferredInitializeMode)),Js::InitializeFunctionDeferredTypeHandlerFilter<true,true,false>,false,(unsigned_short)0,(unsigned_short)0>
                     ::defaultInstance ||
          puVar1 == &DeferredTypeHandler<&Js::JavascriptExternalFunction::DeferredLengthInitializer,Js::InitializeFunctionDeferredTypeHandlerFilter<true,true,true>,false,(unsigned_short)0,(unsigned_short)0>
                     ::defaultInstance) {
        type = (this->crossSiteDeferredPrototypeFunctionType).ptr;
      }
      else if (puVar1 == &DeferredTypeHandler<&(bool_Js::JavascriptLibrary::InitializeFunction<false,true,false,false>(Js::DynamicObject*,Js::DeferredTypeHandlerBase*,Js::DeferredInitializeMode)),Js::InitializeFunctionDeferredTypeHandlerFilter<true,false,false>,false,(unsigned_short)0,(unsigned_short)0>
                          ::defaultInstance ||
               puVar1 == &DeferredTypeHandler<&(bool_Js::JavascriptLibrary::InitializeFunction<false,true,true,true>(Js::DynamicObject*,Js::DeferredTypeHandlerBase*,Js::DeferredInitializeMode)),Js::InitializeFunctionDeferredTypeHandlerFilter<true,false,true>,false,(unsigned_short)0,(unsigned_short)0>
                          ::defaultInstance) {
        type = (this->crossSiteDeferredFunctionType).ptr;
      }
      else if (puVar1 == &DeferredTypeHandler<&Js::JavascriptExternalFunction::DeferredConstructorInitializer,Js::DefaultDeferredTypeFilter,false,(unsigned_short)0,(unsigned_short)0>
                          ::defaultInstance) {
        type = (this->crossSiteExternalConstructFunctionWithPrototypeType).ptr;
      }
      else {
        if (puVar1 != (undefined8 *)SharedIdMappedFunctionWithPrototypeTypeHandler)
        goto LAB_00bfd8c3;
        type = (this->crossSiteIdMappedFunctionWithPrototypeType).ptr;
      }
      DynamicObject::ReplaceType(&function->super_DynamicObject,type);
      return;
    }
  }
LAB_00bfd8c3:
  SetCrossSiteForLockedNonBuiltInFunctionType(this,function);
  return;
}

Assistant:

void JavascriptLibrary::SetCrossSiteForLockedFunctionType(JavascriptFunction * function)
    {
        Assert(function->GetDynamicType()->GetIsLocked());

        if (VarIs<ScriptFunction>(function) || VarIs<BoundFunction>(function))
        {
            this->SetCrossSiteForLockedNonBuiltInFunctionType(function);
        }
        else
        {
            DynamicTypeHandler * typeHandler = function->GetDynamicType()->GetTypeHandler();
            if (typeHandler == JavascriptLibrary::GetDeferredPrototypeFunctionTypeHandler(this->GetScriptContext())
                || typeHandler == JavascriptLibrary::GetDeferredPrototypeFunctionWithLengthTypeHandler(this->GetScriptContext()))
            {
                function->ReplaceType(crossSiteDeferredPrototypeFunctionType);
            }
            else if (typeHandler == JavascriptLibrary::GetDeferredFunctionTypeHandler()
                || typeHandler == JavascriptLibrary::GetDeferredFunctionWithLengthTypeHandler())
            {
                function->ReplaceType(crossSiteDeferredFunctionType);
            }
            else if (typeHandler == Js::DeferredTypeHandler<Js::JavascriptExternalFunction::DeferredConstructorInitializer>::GetDefaultInstance())
            {
                function->ReplaceType(crossSiteExternalConstructFunctionWithPrototypeType);
            }
            else if (typeHandler == &SharedIdMappedFunctionWithPrototypeTypeHandler)
            {
                function->ReplaceType(crossSiteIdMappedFunctionWithPrototypeType);
            }
            else
            {
                this->SetCrossSiteForLockedNonBuiltInFunctionType(function);
            }
        }
    }